

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFModulusGF.cpp
# Opt level: O3

void __thiscall ZXing::Pdf417::ModulusGF::ModulusGF(ModulusGF *this,int modulus,int generator)

{
  vector<short,_std::allocator<short>_> *this_00;
  pointer psVar1;
  pointer psVar2;
  void *pvVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  allocator_type local_51;
  vector<int,_std::allocator<int>_> local_50;
  int local_34;
  
  this->_modulus = modulus;
  this_00 = &this->_expTable;
  (this->_expTable).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_expTable).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_expTable).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_logTable).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_logTable).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_logTable).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_34 = 0;
  __l._M_len = 1;
  __l._M_array = &local_34;
  std::vector<int,_std::allocator<int>_>::vector(&local_50,__l,&local_51);
  ModulusPoly::ModulusPoly(&this->_zero,this,&local_50);
  pvVar3 = (void *)CONCAT62(local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._2_6_,
                            local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._0_2_);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,(long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pvVar3);
  }
  local_34 = 1;
  __l_00._M_len = 1;
  __l_00._M_array = &local_34;
  std::vector<int,_std::allocator<int>_>::vector(&local_50,__l_00,&local_51);
  ModulusPoly::ModulusPoly(&this->_one,this,&local_50);
  pvVar3 = (void *)CONCAT62(local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._2_6_,
                            local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._0_2_);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,(long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pvVar3);
  }
  local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_2_ = 0;
  std::vector<short,_std::allocator<short>_>::resize
            (this_00,(long)(modulus * 2),(value_type_conflict4 *)&local_50);
  local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_2_ = 0;
  std::vector<short,_std::allocator<short>_>::resize
            (&this->_logTable,(long)modulus,(value_type_conflict4 *)&local_50);
  if (0 < modulus) {
    psVar1 = (this_00->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar4 = 1;
    uVar5 = 0;
    do {
      psVar1[uVar5] = (short)iVar4;
      iVar4 = (iVar4 * generator) % modulus;
      uVar5 = uVar5 + 1;
    } while ((uint)modulus != uVar5);
  }
  if (modulus <= modulus * 2) {
    psVar1 = (this_00->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar6 = 0;
    do {
      psVar1[(int)(modulus - 1U) + lVar6] = psVar1[lVar6];
      lVar6 = lVar6 + 1;
    } while (modulus + 1 != (int)lVar6);
  }
  if (1 < modulus) {
    psVar1 = (this_00->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
             super__Vector_impl_data._M_start;
    psVar2 = (this->_logTable).super__Vector_base<short,_std::allocator<short>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = 0;
    do {
      psVar2[psVar1[uVar5]] = (short)uVar5;
      uVar5 = uVar5 + 1;
    } while (modulus - 1U != uVar5);
  }
  return;
}

Assistant:

ModulusGF::ModulusGF(int modulus, int generator) :
	_modulus(modulus),
	_zero(*this, { 0 }),
	_one(*this, { 1 })
{
#ifdef ZX_REED_SOLOMON_USE_MORE_MEMORY_FOR_SPEED
	_expTable.resize(modulus * 2, 0);
#else
	_expTable.resize(modulus, 0);
#endif
	_logTable.resize(modulus, 0);
	int x = 1;
	for (int i = 0; i < modulus; i++) {
		_expTable[i] = x;
		x = (x * generator) % modulus;
	}

#ifdef ZX_REED_SOLOMON_USE_MORE_MEMORY_FOR_SPEED
	for (int i = modulus - 1; i < modulus * 2; ++i)
		_expTable[i] = _expTable[i - (modulus - 1)];
#endif

	for (int i = 0; i < modulus - 1; i++) {
		_logTable[_expTable[i]] = i;
	}
	// logTable[0] == 0 but this should never be used
}